

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  pointer pcVar1;
  char *pcVar2;
  char cVar3;
  IResultCapture *pIVar4;
  
  cVar3 = std::uncaught_exception();
  if ((cVar3 == '\0') && (this->m_moved == false)) {
    pIVar4 = getResultCapture();
    (*pIVar4->_vptr_IResultCapture[9])(pIVar4,this);
  }
  pcVar1 = (this->m_info).message._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_info).message.field_2) {
    operator_delete(pcVar1);
  }
  pcVar2 = (this->m_info).macroName.m_data;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
    return;
  }
  return;
}

Assistant:

ScopedMessage::~ScopedMessage() {
        if ( !uncaught_exceptions() && !m_moved ){
            getResultCapture().popScopedMessage(m_info);
        }
    }